

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleUploadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *this_00;
  int iVar3;
  CURLcode CVar4;
  long lVar5;
  FILE *__stream;
  unsigned_long uVar6;
  cURLEasyGuard *this_01;
  ostream *poVar7;
  char *pcVar8;
  bool bVar9;
  pointer pbVar10;
  string filename;
  string errStr;
  cmFileCommandVectorOfChar chunkDebug;
  cmFileCommandVectorOfChar chunkResponse;
  cURLProgressHelper helper;
  string logVar;
  string statusVar;
  string url;
  long local_2c0;
  string local_2b0;
  string local_290 [3];
  ios_base local_220 [264];
  vector<char,_std::allocator<char>_> local_118;
  vector<char,_std::allocator<char>_> local_f8;
  string *local_e0 [2];
  string local_d0;
  string local_b0;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  value_type local_50;
  undefined7 uStack_4f;
  long local_40 [2];
  
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10) < 0x41) {
    local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_290,"UPLOAD must be called with at least three arguments.","");
    cmCommand::SetError(&this->super_cmCommand,local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290[0]._M_dataplus._M_p != &local_290[0].field_2) {
      operator_delete(local_290[0]._M_dataplus._M_p,
                      CONCAT71(local_290[0].field_2._M_allocated_capacity._1_7_,
                               local_290[0].field_2._M_local_buf[0]) + 1);
    }
    return false;
  }
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  pcVar2 = pbVar10[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0,pcVar2,pcVar2 + pbVar10[1]._M_string_length);
  local_70[0] = local_60;
  pcVar2 = pbVar10[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,pcVar2 + pbVar10[2]._M_string_length);
  pbVar10 = pbVar10 + 3;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  lVar5 = 0;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_2c0 = 0;
  bVar9 = false;
  if (pbVar10 !=
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    bVar9 = false;
    local_2c0 = 0;
    lVar5 = 0;
    do {
      iVar3 = std::__cxx11::string::compare((char *)pbVar10);
      if (iVar3 == 0) {
        pbVar10 = pbVar10 + 1;
        if (pbVar10 ==
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_290,"UPLOAD missing time for TIMEOUT.","");
          cmCommand::SetError(&this->super_cmCommand,local_290);
          goto LAB_0028832f;
        }
        lVar5 = atol((pbVar10->_M_dataplus)._M_p);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)pbVar10);
        if (iVar3 == 0) {
          pbVar10 = pbVar10 + 1;
          if (pbVar10 ==
              (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_290,"UPLOAD missing time for INACTIVITY_TIMEOUT.","");
            cmCommand::SetError(&this->super_cmCommand,local_290);
            goto LAB_0028832f;
          }
          local_2c0 = atol((pbVar10->_M_dataplus)._M_p);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)pbVar10);
          if (iVar3 == 0) {
            pbVar10 = pbVar10 + 1;
            if (pbVar10 ==
                (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_290,"UPLOAD missing VAR for LOG.","");
              cmCommand::SetError(&this->super_cmCommand,local_290);
              goto LAB_0028832f;
            }
            std::__cxx11::string::_M_assign((string *)&local_b0);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)pbVar10);
            if (iVar3 == 0) {
              pbVar10 = pbVar10 + 1;
              if (pbVar10 ==
                  (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
                local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_290,"UPLOAD missing VAR for STATUS.","");
                cmCommand::SetError(&this->super_cmCommand,local_290);
                goto LAB_0028832f;
              }
              std::__cxx11::string::_M_assign((string *)&local_90);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)pbVar10);
              bVar9 = (bool)(bVar9 | iVar3 == 0);
            }
          }
        }
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 !=
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  __stream = (FILE *)cmsys::SystemTools::Fopen(&local_2b0,"rb");
  if (__stream == (FILE *)0x0) {
    local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_290,"UPLOAD cannot open file \'","");
    local_e0[0] = &((cURLProgressHelper *)local_e0)->Text;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e0,local_2b0._M_dataplus._M_p,
               local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
    std::__cxx11::string::append((char *)local_e0);
    std::__cxx11::string::_M_append((char *)local_290,(ulong)local_e0[0]);
    if (local_e0[0] != &((cURLProgressHelper *)local_e0)->Text) {
      operator_delete(local_e0[0],(ulong)(local_d0._M_dataplus._M_p + 1));
    }
    cmCommand::SetError(&this->super_cmCommand,local_290);
LAB_0028832f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290[0]._M_dataplus._M_p != &local_290[0].field_2) {
      operator_delete(local_290[0]._M_dataplus._M_p,
                      CONCAT71(local_290[0].field_2._M_allocated_capacity._1_7_,
                               local_290[0].field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    uVar6 = cmsys::SystemTools::FileLength(&local_2b0);
    curl_global_init(3);
    this_01 = (cURLEasyGuard *)curl_easy_init();
    if (this_01 != (cURLEasyGuard *)0x0) {
      CVar4 = curl_easy_setopt(this_01,CURLOPT_FAILONERROR,1);
      if (CVar4 == CURLE_OK) {
        CVar4 = curl_easy_setopt(this_01,CURLOPT_UPLOAD,1);
        if (CVar4 != CURLE_OK) {
          local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_290,"UPLOAD cannot set upload flag: ","");
          curl_easy_strerror(CVar4);
          std::__cxx11::string::append((char *)local_290);
          cmCommand::SetError(&this->super_cmCommand,local_290);
          goto LAB_00288415;
        }
        CVar4 = curl_easy_setopt(this_01,CURLOPT_URL,local_70[0]);
        if (CVar4 != CURLE_OK) {
          local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_290,"UPLOAD cannot set url: ","");
          curl_easy_strerror(CVar4);
          std::__cxx11::string::append((char *)local_290);
          cmCommand::SetError(&this->super_cmCommand,local_290);
          goto LAB_00288415;
        }
        CVar4 = curl_easy_setopt(this_01,CURLOPT_WRITEFUNCTION,
                                 anon_unknown.dwarf_29cd8d::cmWriteToMemoryCallback);
        if (CVar4 != CURLE_OK) {
          local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_290,"UPLOAD cannot set write function: ","");
          curl_easy_strerror(CVar4);
          std::__cxx11::string::append((char *)local_290);
          cmCommand::SetError(&this->super_cmCommand,local_290);
          goto LAB_00288415;
        }
        CVar4 = curl_easy_setopt(this_01,CURLOPT_DEBUGFUNCTION,
                                 anon_unknown.dwarf_29cd8d::cmFileCommandCurlDebugCallback);
        if (CVar4 != CURLE_OK) {
          local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_290,"UPLOAD cannot set debug function: ","");
          curl_easy_strerror(CVar4);
          std::__cxx11::string::append((char *)local_290);
          cmCommand::SetError(&this->super_cmCommand,local_290);
          goto LAB_00288415;
        }
        local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_118.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_118.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_118.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        CVar4 = curl_easy_setopt(this_01,CURLOPT_WRITEDATA);
        if (CVar4 == CURLE_OK) {
          CVar4 = curl_easy_setopt(this_01,CURLOPT_DEBUGDATA,&local_118);
          if (CVar4 != CURLE_OK) {
            local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_290,"UPLOAD cannot set debug data: ","");
            curl_easy_strerror(CVar4);
            std::__cxx11::string::append((char *)local_290);
            cmCommand::SetError(&this->super_cmCommand,local_290);
            goto LAB_0028861f;
          }
          CVar4 = curl_easy_setopt(this_01,CURLOPT_FOLLOWLOCATION,1);
          if (CVar4 != CURLE_OK) {
            local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_290,"UPLOAD cannot set follow-redirect option: ","");
            curl_easy_strerror(CVar4);
            std::__cxx11::string::append((char *)local_290);
            cmCommand::SetError(&this->super_cmCommand,local_290);
            goto LAB_0028861f;
          }
          if ((local_b0._M_string_length != 0) &&
             (CVar4 = curl_easy_setopt(this_01,CURLOPT_VERBOSE,1), CVar4 != CURLE_OK)) {
            local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_290,"UPLOAD cannot set verbose: ","");
            curl_easy_strerror(CVar4);
            std::__cxx11::string::append((char *)local_290);
            cmCommand::SetError(&this->super_cmCommand,local_290);
            goto LAB_0028861f;
          }
          if ((0 < lVar5) &&
             (CVar4 = curl_easy_setopt(this_01,CURLOPT_TIMEOUT,lVar5), CVar4 != CURLE_OK)) {
            local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_290,"UPLOAD cannot set timeout: ","");
            curl_easy_strerror(CVar4);
            std::__cxx11::string::append((char *)local_290);
            cmCommand::SetError(&this->super_cmCommand,local_290);
            goto LAB_0028861f;
          }
          if (0 < local_2c0) {
            curl_easy_setopt(this_01,CURLOPT_LOW_SPEED_LIMIT,1);
            curl_easy_setopt(this_01,CURLOPT_LOW_SPEED_TIME,local_2c0);
          }
          anon_unknown.dwarf_29cd8d::cURLProgressHelper::cURLProgressHelper
                    ((cURLProgressHelper *)local_e0,this,"upload");
          if (bVar9) {
            CVar4 = curl_easy_setopt(this_01,CURLOPT_NOPROGRESS,0);
            if (CVar4 == CURLE_OK) {
              CVar4 = curl_easy_setopt(this_01,CURLOPT_PROGRESSFUNCTION,
                                       anon_unknown.dwarf_29cd8d::cmFileUploadProgressCallback);
              if (CVar4 == CURLE_OK) {
                CVar4 = curl_easy_setopt(this_01,CURLOPT_PROGRESSDATA,(cURLProgressHelper *)local_e0
                                        );
                if (CVar4 == CURLE_OK) goto LAB_002888d2;
                local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_290,"UPLOAD cannot set progress data: ","");
                curl_easy_strerror(CVar4);
                std::__cxx11::string::append((char *)local_290);
                cmCommand::SetError(&this->super_cmCommand,local_290);
              }
              else {
                local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_290,"UPLOAD cannot set progress function: ","");
                curl_easy_strerror(CVar4);
                std::__cxx11::string::append((char *)local_290);
                cmCommand::SetError(&this->super_cmCommand,local_290);
              }
            }
            else {
              local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_290,"UPLOAD cannot set noprogress value: ","");
              curl_easy_strerror(CVar4);
              std::__cxx11::string::append((char *)local_290);
              cmCommand::SetError(&this->super_cmCommand,local_290);
            }
LAB_00288990:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290[0]._M_dataplus._M_p != &local_290[0].field_2) {
              operator_delete(local_290[0]._M_dataplus._M_p,
                              CONCAT71(local_290[0].field_2._M_allocated_capacity._1_7_,
                                       local_290[0].field_2._M_local_buf[0]) + 1);
            }
            bVar9 = false;
          }
          else {
LAB_002888d2:
            CVar4 = curl_easy_setopt(this_01,CURLOPT_READDATA,__stream);
            if (CVar4 != CURLE_OK) {
              local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_290,"UPLOAD cannot set input file: ","");
              curl_easy_strerror(CVar4);
              std::__cxx11::string::append((char *)local_290);
              cmCommand::SetError(&this->super_cmCommand,local_290);
              goto LAB_00288990;
            }
            CVar4 = curl_easy_setopt(this_01,CURLOPT_INFILESIZE,uVar6);
            if (CVar4 != CURLE_OK) {
              local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_290,"UPLOAD cannot set input file size: ","");
              curl_easy_strerror(CVar4);
              std::__cxx11::string::append((char *)local_290);
              cmCommand::SetError(&this->super_cmCommand,local_290);
              goto LAB_00288990;
            }
            CVar4 = curl_easy_perform(this_01);
            curl_easy_cleanup(this_01);
            if (local_90._M_string_length != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
              poVar7 = (ostream *)std::ostream::operator<<(local_290,CVar4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,";\"",2);
              pcVar8 = curl_easy_strerror(CVar4);
              poVar7 = std::operator<<(poVar7,pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
              this_00 = (this->super_cmCommand).Makefile;
              std::__cxx11::stringbuf::str();
              cmMakefile::AddDefinition(this_00,&local_90,(char *)CONCAT71(uStack_4f,local_50));
              if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
                operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
              std::ios_base::~ios_base(local_220);
            }
            curl_global_cleanup();
            fclose(__stream);
            bVar9 = true;
            if (local_b0._M_string_length != 0) {
              paVar1 = &local_290[0].field_2;
              local_290[0]._M_string_length = 0;
              local_290[0].field_2._M_local_buf[0] = '\0';
              local_290[0]._M_dataplus._M_p = (pointer)paVar1;
              if (local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                local_50 = '\0';
                std::vector<char,_std::allocator<char>_>::push_back(&local_f8,&local_50);
                std::__cxx11::string::append((char *)local_290);
                std::__cxx11::string::append((char *)local_290);
                std::__cxx11::string::append((char *)local_290);
              }
              if (local_118.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  local_118.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                local_50 = '\0';
                std::vector<char,_std::allocator<char>_>::push_back(&local_118,&local_50);
                std::__cxx11::string::append((char *)local_290);
                std::__cxx11::string::append((char *)local_290);
                std::__cxx11::string::append((char *)local_290);
              }
              cmMakefile::AddDefinition
                        ((this->super_cmCommand).Makefile,&local_b0,local_290[0]._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290[0]._M_dataplus._M_p != paVar1) {
                operator_delete(local_290[0]._M_dataplus._M_p,
                                CONCAT71(local_290[0].field_2._M_allocated_capacity._1_7_,
                                         local_290[0].field_2._M_local_buf[0]) + 1);
              }
            }
            this_01 = (cURLEasyGuard *)0x0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&((cURLProgressHelper *)local_e0)->Text + 0x10U)) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_290,"UPLOAD cannot set write data: ","");
          curl_easy_strerror(CVar4);
          std::__cxx11::string::append((char *)local_290);
          cmCommand::SetError(&this->super_cmCommand,local_290);
LAB_0028861f:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290[0]._M_dataplus._M_p != &local_290[0].field_2) {
            operator_delete(local_290[0]._M_dataplus._M_p,
                            CONCAT71(local_290[0].field_2._M_allocated_capacity._1_7_,
                                     local_290[0].field_2._M_local_buf[0]) + 1);
          }
          bVar9 = false;
        }
        if (local_118.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_118.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      else {
        local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_290,"UPLOAD cannot set fail on error flag: ","");
        curl_easy_strerror(CVar4);
        std::__cxx11::string::append((char *)local_290);
        cmCommand::SetError(&this->super_cmCommand,local_290);
LAB_00288415:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290[0]._M_dataplus._M_p != &local_290[0].field_2) {
          operator_delete(local_290[0]._M_dataplus._M_p,
                          CONCAT71(local_290[0].field_2._M_allocated_capacity._1_7_,
                                   local_290[0].field_2._M_local_buf[0]) + 1);
        }
        bVar9 = false;
      }
      anon_unknown.dwarf_29cd8d::cURLEasyGuard::~cURLEasyGuard(this_01);
      goto LAB_00288436;
    }
    local_290[0]._M_dataplus._M_p = (pointer)&local_290[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_290,"UPLOAD error initializing curl.","");
    cmCommand::SetError(&this->super_cmCommand,local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290[0]._M_dataplus._M_p != &local_290[0].field_2) {
      operator_delete(local_290[0]._M_dataplus._M_p,
                      CONCAT71(local_290[0].field_2._M_allocated_capacity._1_7_,
                               local_290[0].field_2._M_local_buf[0]) + 1);
    }
    fclose(__stream);
  }
  bVar9 = false;
LAB_00288436:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  return bVar9;
}

Assistant:

bool
cmFileCommand::HandleUploadCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  if(args.size() < 3)
    {
    this->SetError("UPLOAD must be called with at least three arguments.");
    return false;
    }
  std::vector<std::string>::const_iterator i = args.begin();
  ++i;
  std::string filename = *i;
  ++i;
  std::string url = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool showProgress = false;

  while(i != args.end())
    {
    if(*i == "TIMEOUT")
      {
      ++i;
      if(i != args.end())
        {
        timeout = atol(i->c_str());
        }
      else
        {
        this->SetError("UPLOAD missing time for TIMEOUT.");
        return false;
        }
      }
    else if(*i == "INACTIVITY_TIMEOUT")
      {
      ++i;
      if(i != args.end())
        {
        inactivity_timeout = atol(i->c_str());
        }
      else
        {
        this->SetError("UPLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
        }
      }
    else if(*i == "LOG")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("UPLOAD missing VAR for LOG.");
        return false;
        }
      logVar = *i;
      }
    else if(*i == "STATUS")
      {
      ++i;
      if( i == args.end())
        {
        this->SetError("UPLOAD missing VAR for STATUS.");
        return false;
        }
      statusVar = *i;
      }
    else if(*i == "SHOW_PROGRESS")
      {
      showProgress = true;
      }

    ++i;
    }

  // Open file for reading:
  //
  FILE *fin = cmsys::SystemTools::Fopen(filename, "rb");
  if(!fin)
    {
    std::string errStr = "UPLOAD cannot open file '";
    errStr += filename + "' for reading.";
    this->SetError(errStr);
    return false;
    }

  unsigned long file_size = cmsys::SystemTools::FileLength(filename);

#if defined(_WIN32) && defined(CMAKE_ENCODING_UTF8)
  url = fix_file_url_windows(url);
#endif

  ::CURL *curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if(!curl)
    {
    this->SetError("UPLOAD error initializing curl.");
    fclose(fin);
    return false;
    }

  cURLEasyGuard g_curl(curl);

  // enable HTTP ERROR parsing
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "UPLOAD cannot set fail on error flag: ");

  // enable uploading
  res = ::curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);
  check_curl_result(res, "UPLOAD cannot set upload flag: ");

  res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "UPLOAD cannot set url: ");

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                           cmWriteToMemoryCallback);
  check_curl_result(res, "UPLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "UPLOAD cannot set debug function: ");

  cmFileCommandVectorOfChar chunkResponse;
  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, (void *)&chunkResponse);
  check_curl_result(res, "UPLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, (void *)&chunkDebug);
  check_curl_result(res, "UPLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "UPLOAD cannot set follow-redirect option: ");

  if(!logVar.empty())
    {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "UPLOAD cannot set verbose: ");
    }

  if(timeout > 0)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout );
    check_curl_result(res, "UPLOAD cannot set timeout: ");
    }

  if(inactivity_timeout > 0)
    {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
    }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(this, "upload");

  if(showProgress)
    {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "UPLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl,
      CURLOPT_PROGRESSFUNCTION, cmFileUploadProgressCallback);
    check_curl_result(res, "UPLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl,
      CURLOPT_PROGRESSDATA, reinterpret_cast<void*>(&helper));
    check_curl_result(res, "UPLOAD cannot set progress data: ");
    }

  // now specify which file to upload
  res = ::curl_easy_setopt(curl, CURLOPT_INFILE, fin);
  check_curl_result(res, "UPLOAD cannot set input file: ");

  // and give the size of the upload (optional)
  res = ::curl_easy_setopt(curl,
    CURLOPT_INFILESIZE, static_cast<long>(file_size));
  check_curl_result(res, "UPLOAD cannot set input file size: ");

  res = ::curl_easy_perform(curl);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if(!statusVar.empty())
    {
    std::ostringstream result;
    result << (int)res << ";\"" << ::curl_easy_strerror(res) << "\"";
    this->Makefile->AddDefinition(statusVar,
                                  result.str().c_str());
    }

  ::curl_global_cleanup();

  fclose(fin);
  fin = NULL;

  if(!logVar.empty())
    {
    std::string log;

    if(!chunkResponse.empty())
      {
      chunkResponse.push_back(0);
      log += "Response:\n";
      log += &*chunkResponse.begin();
      log += "\n";
      }

    if(!chunkDebug.empty())
      {
      chunkDebug.push_back(0);
      log += "Debug:\n";
      log += &*chunkDebug.begin();
      log += "\n";
      }

    this->Makefile->AddDefinition(logVar, log.c_str());
    }

  return true;
#else
  this->SetError("UPLOAD not supported by bootstrap cmake.");
  return false;
#endif
}